

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O1

uint __thiscall
llvm::DWARFVerifier::verifyUnitSection
          (DWARFVerifier *this,DWARFSection *S,DWARFSectionKind SectionKind)

{
  SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  *pSVar1;
  DWARFObject *pDVar2;
  DWARFContext *pDVar3;
  bool bVar4;
  DWARFDataExtractor DebugInfoData_00;
  StringRef SS;
  StringRef SS_00;
  bool bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined7 uVar14;
  DWARFDebugAbbrev *pDVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_> this_00;
  DWARFUnit *pDVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  raw_ostream *this_01;
  undefined8 uVar15;
  long lVar16;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  undefined1 in_R8B;
  bool *isUnitDWARF64_00;
  StringRef Str;
  undefined1 local_1d0 [8];
  DWARFUnitHeader Header;
  DWARFUnitVector CompileUnitVector;
  DWARFUnitVector TypeUnitVector;
  undefined1 auStack_e0 [8];
  DWARFDataExtractor DebugInfoData;
  uint64_t OffsetStart;
  DWARFSection *local_88;
  uint64_t Offset;
  DWARFContext *local_78;
  DWARFDebugAbbrev *local_70;
  DWARFSection *local_68;
  ulong local_60;
  _Head_base<0UL,_llvm::DWARFUnit_*,_false> local_58;
  __uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> local_50;
  undefined4 local_44;
  DWARFVerifier *local_40;
  byte local_32;
  bool local_31 [7];
  uint8_t UnitType;
  bool isUnitDWARF64;
  
  pDVar2 = (this->DCtx->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  local_40 = this;
  iVar7 = (*pDVar2->_vptr_DWARFObject[5])(pDVar2);
  auStack_e0 = (undefined1  [8])(S->Data).Data;
  DebugInfoData.super_DataExtractor.Data.Data = (char *)(S->Data).Length;
  DebugInfoData.super_DataExtractor.Data.Length._0_1_ = (undefined1)iVar7;
  CompileUnitVector._56_8_ =
       &TypeUnitVector.
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
        .
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Size;
  TypeUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX = (void *)0x100000000;
  TypeUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  .InlineElts[0].buffer =
       (AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
         [1])(AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              )0x0;
  TypeUnitVector.Parser.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  TypeUnitVector.Parser.super__Function_base._M_functor._8_8_ = 0;
  TypeUnitVector.Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  TypeUnitVector.Parser._M_invoker._0_4_ = 0xffffffff;
  Header._72_8_ =
       &CompileUnitVector.
        super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
        .
        super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
        .
        super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
        .
        super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
        .super_SmallVectorBase.Size;
  CompileUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorImpl<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>.
  super_SmallVectorTemplateBase<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_false>
  .
  super_SmallVectorTemplateCommon<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_void>
  .super_SmallVectorBase.BeginX = (void *)0x100000000;
  DebugInfoData.super_DataExtractor.Data.Length._1_1_ = 0;
  DebugInfoData.Section = (DWARFSection *)0x0;
  local_88 = (DWARFSection *)0x0;
  local_32 = 0;
  local_31[0] = false;
  CompileUnitVector.
  super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>.
  super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
  .InlineElts[0].buffer =
       (AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
         [1])(AlignedCharArrayUnion<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>_>
              )0x0;
  CompileUnitVector.Parser.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  CompileUnitVector.Parser.super__Function_base._M_functor._8_8_ = 0;
  CompileUnitVector.Parser.super__Function_base._M_manager = (_Manager_type)0x0;
  CompileUnitVector.Parser._M_invoker._0_4_ = 0xffffffff;
  bVar4 = DebugInfoData.super_DataExtractor.Data.Data != (char *)0x0;
  uVar14 = (undefined7)((ulong)Header._72_8_ >> 8);
  DebugInfoData.super_DataExtractor._16_8_ = pDVar2;
  DebugInfoData.Obj = (DWARFObject *)S;
  if (DebugInfoData.super_DataExtractor.Data.Data == (char *)0x0) {
    local_60 = 0;
    local_44 = (undefined4)CONCAT71(uVar14,1);
    bVar5 = false;
  }
  else {
    local_44 = (undefined4)CONCAT71(uVar14,1);
    lVar16 = 0;
    local_60 = 0;
    do {
      DebugInfoData.Section = local_88;
      DebugInfoData_00.super_DataExtractor.AddressSize =
           DebugInfoData.super_DataExtractor.Data.Length._1_1_;
      DebugInfoData_00.super_DataExtractor.IsLittleEndian =
           (undefined1)DebugInfoData.super_DataExtractor.Data.Length;
      DebugInfoData_00.super_DataExtractor._18_6_ =
           DebugInfoData.super_DataExtractor.Data.Length._2_6_;
      isUnitDWARF64_00 = local_31;
      DebugInfoData_00.super_DataExtractor.Data.Length =
           (size_t)DebugInfoData.super_DataExtractor.Data.Data;
      DebugInfoData_00.super_DataExtractor.Data.Data = (char *)auStack_e0;
      DebugInfoData_00.Obj = (DWARFObject *)DebugInfoData.super_DataExtractor._16_8_;
      DebugInfoData_00.Section = (DWARFSection *)DebugInfoData.Obj;
      bVar5 = verifyUnitHeader(local_40,DebugInfoData_00,(uint64_t *)&local_88,(uint)lVar16,
                               &local_32,isUnitDWARF64_00);
      in_R8B = SUB81(isUnitDWARF64_00,0);
      if (bVar5) {
        local_1d0 = (undefined1  [8])0x0;
        Header.DWOId.Storage.field_0.empty = '\0';
        Header.DWOId.Storage.hasVal = false;
        Header.DWOId.Storage._9_1_ = 0;
        Header.TypeHash._0_1_ = 0;
        Header._41_8_ = 0;
        Header.AbbrOffset = 0;
        Header.IndexEntry._0_1_ = 0;
        Header.IndexEntry._1_7_ = 0;
        Header.FormParams.Version = 0;
        Header.FormParams.AddrSize = '\0';
        Header.FormParams.Format = DWARF32;
        Header._12_4_ = 0;
        Header.Length = 0;
        DWARFUnitHeader::extract
                  ((DWARFUnitHeader *)local_1d0,local_40->DCtx,(DWARFDataExtractor *)auStack_e0,
                   (uint64_t *)&DebugInfoData.Section,SectionKind,(DWARFUnitIndex *)0x0,(Entry *)0x0
                  );
        if (6 < local_32) {
          llvm_unreachable_internal
                    ("Invalid UnitType.",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp"
                     ,0x141);
        }
        if ((0x3bU >> (local_32 & 0x1f) & 1) == 0) {
          pDVar3 = local_40->DCtx;
          pDVar12 = DWARFContext::getDebugAbbrev(pDVar3);
          iVar7 = (*pDVar2->_vptr_DWARFObject[0x12])(pDVar2);
          iVar8 = (*pDVar2->_vptr_DWARFObject[10])(pDVar2);
          Offset = CONCAT44(extraout_var_06,iVar8);
          iVar8 = (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
          SS_00.Data._4_4_ = extraout_var_07;
          SS_00.Data._0_4_ = iVar8;
          iVar8 = (*pDVar2->_vptr_DWARFObject[0x19])(pDVar2);
          local_78 = pDVar3;
          local_70 = pDVar12;
          local_68 = (DWARFSection *)CONCAT44(extraout_var_05,iVar7);
          iVar7 = (*pDVar2->_vptr_DWARFObject[0x28])(pDVar2);
          iVar9 = (*pDVar2->_vptr_DWARFObject[0xf])(pDVar2);
          iVar10 = (*((local_40->DCtx->DObj)._M_t.
                      super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                      .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                     _vptr_DWARFObject[5])();
          pDVar13 = (DWARFUnit *)operator_new(0x200);
          SS_00.Length = extraout_RDX_00;
          pDVar12 = local_70;
          DWARFUnit::DWARFUnit
                    (pDVar13,local_78,S,(DWARFUnitHeader *)local_1d0,local_70,local_68,
                     (DWARFSection *)Offset,SS_00,(DWARFSection *)CONCAT44(extraout_var_08,iVar8),
                     (DWARFSection *)CONCAT44(extraout_var_09,iVar7),
                     (DWARFSection *)CONCAT44(extraout_var_10,iVar9),SUB41(iVar10,0),false,
                     (DWARFUnitVector *)&CompileUnitVector.NumInfoUnits);
          in_R8B = SUB81(pDVar12,0);
          pDVar13->_vptr_DWARFUnit = (_func_int **)&PTR__DWARFUnit_01098ad8;
          local_58._M_head_impl = pDVar13;
          pDVar13 = DWARFUnitVector::addUnit
                              ((DWARFUnitVector *)&CompileUnitVector.NumInfoUnits,
                               (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *
                               )&local_58);
          if (local_58._M_head_impl != (DWARFUnit *)0x0) {
            (*(local_58._M_head_impl)->_vptr_DWARFUnit[1])();
          }
          local_58._M_head_impl = (DWARFUnit *)0x0;
        }
        else {
          pDVar3 = local_40->DCtx;
          pDVar12 = DWARFContext::getDebugAbbrev(pDVar3);
          iVar7 = (*pDVar2->_vptr_DWARFObject[0x12])(pDVar2);
          iVar8 = (*pDVar2->_vptr_DWARFObject[10])(pDVar2);
          Offset = CONCAT44(extraout_var_00,iVar8);
          iVar8 = (*pDVar2->_vptr_DWARFObject[0x11])(pDVar2);
          SS.Data._4_4_ = extraout_var_01;
          SS.Data._0_4_ = iVar8;
          iVar8 = (*pDVar2->_vptr_DWARFObject[0x19])(pDVar2);
          local_78 = pDVar3;
          local_70 = pDVar12;
          local_68 = (DWARFSection *)CONCAT44(extraout_var,iVar7);
          TypeUnitVector.NumInfoUnits = (*pDVar2->_vptr_DWARFObject[0x28])(pDVar2);
          TypeUnitVector._60_4_ = extraout_var_03;
          iVar7 = (*pDVar2->_vptr_DWARFObject[0xf])(pDVar2);
          iVar9 = (*((local_40->DCtx->DObj)._M_t.
                     super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
                     .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
                    _vptr_DWARFObject[5])();
          this_00.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               operator_new(0x200);
          SS.Length = extraout_RDX;
          pDVar12 = local_70;
          DWARFUnit::DWARFUnit
                    ((DWARFUnit *)
                     this_00.
                     super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                     .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,local_78,S,
                     (DWARFUnitHeader *)local_1d0,local_70,local_68,(DWARFSection *)Offset,SS,
                     (DWARFSection *)CONCAT44(extraout_var_02,iVar8),
                     (DWARFSection *)TypeUnitVector._56_8_,
                     (DWARFSection *)CONCAT44(extraout_var_04,iVar7),SUB41(iVar9,0),false,
                     (DWARFUnitVector *)&Header.UnitType);
          in_R8B = SUB81(pDVar12,0);
          *(undefined ***)
           this_00.super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
           super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               &PTR__DWARFCompileUnit_01098050;
          local_50._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               this_00.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl;
          pDVar13 = DWARFUnitVector::addUnit
                              ((DWARFUnitVector *)&Header.UnitType,
                               (unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_> *
                               )&local_50);
          if ((_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
              local_50._M_t.
              super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
              super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl != (DWARFUnit *)0x0) {
            (**(code **)(*(long *)local_50._M_t.
                                  super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>
                                  .super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl + 8)
            )();
          }
          local_50._M_t.
          super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
          super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl =
               (tuple<llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)
               (_Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>)0x0;
        }
        uVar11 = verifyUnitContents(local_40,pDVar13);
        local_60 = (ulong)((int)local_60 + uVar11);
      }
      else {
        local_44 = 0;
        if (local_31[0] != false) break;
      }
      lVar16 = lVar16 + 1;
      bVar4 = local_88 < DebugInfoData.super_DataExtractor.Data.Data;
    } while (local_88 < DebugInfoData.super_DataExtractor.Data.Data);
    bVar5 = lVar16 != 0;
  }
  if ((!bVar5) && (!bVar4)) {
    uVar15 = 0;
    this_01 = WithColor::warning((WithColor *)local_40->OS,(raw_ostream *)0xe85cd6,
                                 (StringRef)ZEXT816(0),(bool)in_R8B);
    local_44 = (undefined4)CONCAT71((int7)((ulong)uVar15 >> 8),1);
    Str.Length = 0x12;
    Str.Data = "Section is empty.\n";
    raw_ostream::operator<<(this_01,Str);
  }
  uVar11 = verifyDebugInfoReferences(local_40);
  if (CompileUnitVector.Parser.super__Function_base._M_functor._8_8_ != 0) {
    pSVar1 = &CompileUnitVector.
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
    ;
    (*(code *)CompileUnitVector.Parser.super__Function_base._M_functor._8_8_)(pSVar1,pSVar1,3);
  }
  SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>::
  ~SmallVector((SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                *)&Header.UnitType);
  if (TypeUnitVector.Parser.super__Function_base._M_functor._8_8_ != 0) {
    pSVar1 = &TypeUnitVector.
              super_SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
              .
              super_SmallVectorStorage<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
    ;
    (*(code *)TypeUnitVector.Parser.super__Function_base._M_functor._8_8_)(pSVar1,pSVar1,3);
  }
  bVar6 = (byte)local_44;
  iVar7 = uVar11 + (int)local_60;
  SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>::
  ~SmallVector((SmallVector<std::unique_ptr<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>,_1U>
                *)&CompileUnitVector.NumInfoUnits);
  return iVar7 + (uint)(~bVar6 & 1);
}

Assistant:

unsigned DWARFVerifier::verifyUnitSection(const DWARFSection &S,
                                          DWARFSectionKind SectionKind) {
  const DWARFObject &DObj = DCtx.getDWARFObj();
  DWARFDataExtractor DebugInfoData(DObj, S, DCtx.isLittleEndian(), 0);
  unsigned NumDebugInfoErrors = 0;
  uint64_t OffsetStart = 0, Offset = 0, UnitIdx = 0;
  uint8_t UnitType = 0;
  bool isUnitDWARF64 = false;
  bool isHeaderChainValid = true;
  bool hasDIE = DebugInfoData.isValidOffset(Offset);
  DWARFUnitVector TypeUnitVector;
  DWARFUnitVector CompileUnitVector;
  while (hasDIE) {
    OffsetStart = Offset;
    if (!verifyUnitHeader(DebugInfoData, &Offset, UnitIdx, UnitType,
                          isUnitDWARF64)) {
      isHeaderChainValid = false;
      if (isUnitDWARF64)
        break;
    } else {
      DWARFUnitHeader Header;
      Header.extract(DCtx, DebugInfoData, &OffsetStart, SectionKind);
      DWARFUnit *Unit;
      switch (UnitType) {
      case dwarf::DW_UT_type:
      case dwarf::DW_UT_split_type: {
        Unit = TypeUnitVector.addUnit(std::make_unique<DWARFTypeUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            TypeUnitVector));
        break;
      }
      case dwarf::DW_UT_skeleton:
      case dwarf::DW_UT_split_compile:
      case dwarf::DW_UT_compile:
      case dwarf::DW_UT_partial:
      // UnitType = 0 means that we are verifying a compile unit in DWARF v4.
      case 0: {
        Unit = CompileUnitVector.addUnit(std::make_unique<DWARFCompileUnit>(
            DCtx, S, Header, DCtx.getDebugAbbrev(), &DObj.getRangesSection(),
            &DObj.getLocSection(), DObj.getStrSection(),
            DObj.getStrOffsetsSection(), &DObj.getAppleObjCSection(),
            DObj.getLineSection(), DCtx.isLittleEndian(), false,
            CompileUnitVector));
        break;
      }
      default: { llvm_unreachable("Invalid UnitType."); }
      }
      NumDebugInfoErrors += verifyUnitContents(*Unit);
    }
    hasDIE = DebugInfoData.isValidOffset(Offset);
    ++UnitIdx;
  }
  if (UnitIdx == 0 && !hasDIE) {
    warn() << "Section is empty.\n";
    isHeaderChainValid = true;
  }
  if (!isHeaderChainValid)
    ++NumDebugInfoErrors;
  NumDebugInfoErrors += verifyDebugInfoReferences();
  return NumDebugInfoErrors;
}